

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O1

int process_start(char *name,char *part,process_info_t *p,int is_helper)

{
  int iVar1;
  uint uVar2;
  __pid_t _Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  FILE *__stream;
  ssize_t sVar7;
  int *piVar8;
  uint extraout_EDX;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *unaff_R13;
  int n;
  int pipefd [2];
  char fdstr [8];
  char *args [16];
  timeval tStack_210;
  int aiStack_1f8 [2];
  ulong uStack_1f0;
  uint uStack_1e8;
  ulong uStack_1e0;
  timeval tStack_1d8;
  pthread_t pStack_1c8;
  fd_set fStack_1c0;
  pthread_attr_t pStack_140;
  ulong uStack_108;
  FILE *pFStack_100;
  char *pcStack_f8;
  process_info_t *ppStack_f0;
  char *pcStack_e8;
  code *pcStack_e0;
  int local_cc;
  int local_c8;
  uint local_c4;
  char local_c0 [8];
  char *local_b8 [4];
  char *local_98;
  
  pcStack_e0 = (code *)0x14fbca;
  pcVar5 = getenv("UV_USE_VALGRIND");
  local_cc = 0;
  if (pcVar5 != (char *)0x0 && is_helper == 0) {
    pcStack_e0 = (code *)0x14fbe9;
    iVar1 = atoi(pcVar5);
    if (iVar1 != 0) {
      local_b8[0] = "valgrind";
      local_b8[1] = "--quiet";
      local_b8[2] = "--leak-check=full";
      local_b8[3] = "--show-reachable=yes";
      local_cc = 5;
      local_98 = "--error-exitcode=125";
    }
  }
  lVar6 = (long)local_cc;
  local_b8[lVar6] = executable_path;
  local_b8[lVar6 + 1] = name;
  local_b8[lVar6 + 2] = part;
  local_cc = local_cc + 4;
  local_b8[lVar6 + 3] = (char *)0x0;
  pcStack_e0 = (code *)0x14fc61;
  __stream = tmpfile64();
  pcStack_e0 = (code *)0x14fc6c;
  uVar2 = fileno(__stream);
  if (__stream == (FILE *)0x0) {
    pcVar5 = "tmpfile";
    goto LAB_0014fd81;
  }
  if (is_helper != 0) {
    pcStack_e0 = (code *)0x14fc85;
    iVar1 = pipe(&local_c8);
    if (iVar1 != 0) {
      pcVar5 = "pipe";
      goto LAB_0014fd81;
    }
    unaff_R13 = local_c0;
    pcStack_e0 = (code *)0x14fcac;
    snprintf(unaff_R13,8,"%d",(ulong)local_c4);
    pcStack_e0 = (code *)0x14fcc0;
    iVar1 = setenv("UV_TEST_RUNNER_FD",unaff_R13,1);
    if (iVar1 != 0) {
      pcVar5 = "setenv";
      goto LAB_0014fd81;
    }
  }
  p->status = 0;
  p->terminated = 0;
  pcStack_e0 = (code *)0x14fcd5;
  _Var3 = fork();
  if (-1 < _Var3) {
    if (_Var3 != 0) {
      p->pid = _Var3;
      pcStack_e0 = (code *)0x14fcef;
      pcVar5 = strdup(name);
      p->name = pcVar5;
      p->stdout_file = (FILE *)__stream;
      if (is_helper == 0) {
        return 0;
      }
      pcStack_e0 = (code *)0x14fd09;
      closefd(local_c4);
      pcStack_e0 = (code *)0x14fd15;
      unsetenv("UV_TEST_RUNNER_FD");
      do {
        pcStack_e0 = (code *)0x14fd2b;
        sVar7 = read(local_c8,&local_cc,1);
        if (sVar7 != -1) {
          pcStack_e0 = (code *)0x14fd53;
          closefd(local_c8);
          if (0 < sVar7) {
            pcStack_e0 = (code *)0x14fd5d;
            process_start_cold_1();
            return -1;
          }
          return 0;
        }
        pcStack_e0 = (code *)0x14fd36;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      pcStack_e0 = (code *)0x14fd45;
      process_start_cold_2();
      return -1;
    }
    uVar11 = (ulong)(is_helper == 0);
    uVar10 = (uint)&local_c8;
    pcStack_e0 = process_wait;
    process_start_cold_3();
    aiStack_1f8[0] = -1;
    aiStack_1f8[1] = -1;
    uStack_1f0 = uVar11;
    uStack_1e8 = uVar10;
    uStack_108 = (ulong)(uint)is_helper;
    pFStack_100 = __stream;
    pcStack_f8 = unaff_R13;
    ppStack_f0 = p;
    pcStack_e8 = name;
    pcStack_e0 = (code *)(ulong)uVar2;
    if (extraout_EDX == 0xffffffff) {
      dowait(aiStack_1f8);
      iVar1 = 0;
    }
    else {
      iVar1 = pipe(aiStack_1f8);
      if (iVar1 == 0) {
        iVar1 = pthread_attr_init(&pStack_140);
        if ((iVar1 == 0) && (iVar1 = pthread_attr_setstacksize(&pStack_140,0x40000), iVar1 == 0)) {
          iVar1 = pthread_create(&pStack_1c8,&pStack_140,dowait,aiStack_1f8);
          iVar4 = pthread_attr_destroy(&pStack_140);
          if (iVar4 == 0) {
            if (iVar1 != 0) {
              perror("pthread_create()");
              iVar1 = -1;
LAB_00150047:
              close(aiStack_1f8[0]);
              close(aiStack_1f8[1]);
              return iVar1;
            }
            uStack_1e0 = uVar11;
            iVar1 = gettimeofday(&tStack_1d8,(__timezone_ptr_t)0x0);
            if (iVar1 == 0) {
              tStack_210.tv_sec = tStack_1d8.tv_sec;
              tStack_210.tv_usec = tStack_1d8.tv_usec;
              iVar1 = 0;
              do {
                if ((tStack_210.tv_sec <= tStack_1d8.tv_sec) &&
                   ((tStack_210.tv_sec != tStack_1d8.tv_sec ||
                    (tStack_210.tv_usec < tStack_1d8.tv_usec)))) {
                  __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/runner-unix.c"
                                ,0x122,"int process_wait(process_info_t *, int, int)");
                }
                uVar9 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tStack_210.tv_usec),8)
                              >> 7) -
                        (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tStack_210.tv_usec),0xc) >>
                        0x1f)) + ((int)(SUB168(SEXT816(tStack_1d8.tv_usec) *
                                               SEXT816(-0x20c49ba5e353f7cf),8) >> 7) -
                                 (SUB164(SEXT816(tStack_1d8.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),
                                         0xc) >> 0x1f)) +
                        ((int)tStack_210.tv_sec - (int)tStack_1d8.tv_sec) * 1000;
                uVar2 = extraout_EDX - uVar9;
                if (extraout_EDX < uVar9 || uVar2 == 0) {
                  iVar4 = 0;
LAB_0014ffe6:
                  uVar11 = uStack_1e0;
                  if (iVar4 == 0) {
                    iVar1 = -2;
                    if (0 < (int)uVar10) {
                      lVar6 = 0;
                      do {
                        kill(*(__pid_t *)(uVar11 + 8 + lVar6),0xf);
                        lVar6 = lVar6 + 0x20;
                      } while ((ulong)uVar10 << 5 != lVar6);
                    }
                  }
                  else if (iVar4 == -1) {
                    perror("select()");
                    iVar1 = -1;
                  }
                  iVar4 = pthread_join(pStack_1c8,(void **)0x0);
                  if (iVar4 == 0) goto LAB_00150047;
                  break;
                }
                tStack_210.tv_sec = (ulong)uVar2 / 1000;
                tStack_210.tv_usec = (__suseconds_t)((uVar2 % 1000) * 1000);
                fStack_1c0.fds_bits[0] = 0;
                fStack_1c0.fds_bits[1] = 0;
                fStack_1c0.fds_bits[2] = 0;
                fStack_1c0.fds_bits[3] = 0;
                fStack_1c0.fds_bits[4] = 0;
                fStack_1c0.fds_bits[5] = 0;
                fStack_1c0.fds_bits[6] = 0;
                fStack_1c0.fds_bits[7] = 0;
                fStack_1c0.fds_bits[8] = 0;
                fStack_1c0.fds_bits[9] = 0;
                fStack_1c0.fds_bits[10] = 0;
                fStack_1c0.fds_bits[0xb] = 0;
                iVar4 = aiStack_1f8[0] + 0x3f;
                if (-1 < aiStack_1f8[0]) {
                  iVar4 = aiStack_1f8[0];
                }
                fStack_1c0.fds_bits[0xc] = 0;
                fStack_1c0.fds_bits[0xd] = 0;
                fStack_1c0.fds_bits[0xe] = 0;
                fStack_1c0.fds_bits[0xf] = 0;
                fStack_1c0.fds_bits[iVar4 >> 6] =
                     fStack_1c0.fds_bits[iVar4 >> 6] | 1L << ((byte)(aiStack_1f8[0] % 0x40) & 0x3f);
                iVar4 = select(aiStack_1f8[0] + 1,&fStack_1c0,(fd_set *)0x0,(fd_set *)0x0,
                               &tStack_210);
                if (iVar4 != -1) goto LAB_0014ffe6;
                piVar8 = __errno_location();
                if (*piVar8 != 4) {
                  iVar4 = -1;
                  goto LAB_0014ffe6;
                }
                iVar4 = gettimeofday(&tStack_210,(__timezone_ptr_t)0x0);
              } while (iVar4 == 0);
            }
          }
        }
        abort();
      }
      perror("pipe()");
      iVar1 = -1;
    }
    return iVar1;
  }
  pcVar5 = "fork";
LAB_0014fd81:
  pcStack_e0 = (code *)0x14fd86;
  perror(pcVar5);
  return -1;
}

Assistant:

int process_start(char* name, char* part, process_info_t* p, int is_helper) {
  FILE* stdout_file;
  int stdout_fd;
  const char* arg;
  char* args[16];
  int pipefd[2];
  char fdstr[8];
  ssize_t rc;
  int n;
  pid_t pid;

  arg = getenv("UV_USE_VALGRIND");
  n = 0;

  /* Disable valgrind for helpers, it complains about helpers leaking memory.
   * They're killed after the test and as such never get a chance to clean up.
   */
  if (is_helper == 0 && arg != NULL && atoi(arg) != 0) {
    args[n++] = "valgrind";
    args[n++] = "--quiet";
    args[n++] = "--leak-check=full";
    args[n++] = "--show-reachable=yes";
    args[n++] = "--error-exitcode=125";
  }

  args[n++] = executable_path;
  args[n++] = name;
  args[n++] = part;
  args[n++] = NULL;

  stdout_file = tmpfile();
  stdout_fd = fileno(stdout_file);
  if (!stdout_file) {
    perror("tmpfile");
    return -1;
  }

  if (is_helper) {
    if (pipe(pipefd)) {
      perror("pipe");
      return -1;
    }

    snprintf(fdstr, sizeof(fdstr), "%d", pipefd[1]);
    if (setenv("UV_TEST_RUNNER_FD", fdstr, /* overwrite */ 1)) {
      perror("setenv");
      return -1;
    }
  }

  p->terminated = 0;
  p->status = 0;

  pid = fork();

  if (pid < 0) {
    perror("fork");
    return -1;
  }

  if (pid == 0) {
    /* child */
    if (is_helper)
      closefd(pipefd[0]);
    dup2(stdout_fd, STDOUT_FILENO);
    dup2(stdout_fd, STDERR_FILENO);
    execve(args[0], args, environ);
    perror("execve()");
    _exit(127);
  }

  /* parent */
  p->pid = pid;
  p->name = strdup(name);
  p->stdout_file = stdout_file;

  if (!is_helper)
    return 0;

  closefd(pipefd[1]);
  unsetenv("UV_TEST_RUNNER_FD");

  do
    rc = read(pipefd[0], &n, 1);
  while (rc == -1 && errno == EINTR);

  closefd(pipefd[0]);

  if (rc == -1) {
    perror("read");
    return -1;
  }

  if (rc > 0) {
    fprintf(stderr, "EOF expected but got data.\n");
    return -1;
  }

  return 0;
}